

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool __thiscall
re2::RE2::DoMatch(RE2 *this,StringPiece *text,Anchor anchor,int *consumed,Arg **args,int n)

{
  Arg *this_00;
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  iterator pcVar7;
  iterator pcVar8;
  StringPiece *pSVar9;
  char *str;
  StringPiece *local_350;
  StringPiece *local_328;
  StringPiece *s;
  int i;
  int ncap;
  StringPiece *heapvec;
  StringPiece stkvec [17];
  StringPiece *vec;
  int nvec;
  LogMessage local_1c0;
  int local_3c;
  Arg **ppAStack_38;
  int n_local;
  Arg **args_local;
  int *consumed_local;
  StringPiece *pSStack_20;
  Anchor anchor_local;
  StringPiece *text_local;
  RE2 *this_local;
  
  local_3c = n;
  ppAStack_38 = args;
  args_local = (Arg **)consumed;
  consumed_local._4_4_ = anchor;
  pSStack_20 = text;
  text_local = (StringPiece *)this;
  bVar2 = ok(this);
  if (bVar2) {
    if ((local_3c == 0) && (args_local == (Arg **)0x0)) {
      vec._0_4_ = 0;
    }
    else {
      vec._0_4_ = local_3c + 1;
    }
    local_328 = (StringPiece *)&heapvec;
    do {
      StringPiece::StringPiece(local_328);
      local_328 = local_328 + 1;
    } while (local_328 != (StringPiece *)&stkvec[0x10].length_);
    _i = (StringPiece *)0x0;
    if ((int)vec < 0x12) {
      stkvec[0x10]._8_8_ = &heapvec;
    }
    else {
      uVar5 = (ulong)(int)vec;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar5;
      uVar6 = SUB168(auVar1 * ZEXT816(0x10),0);
      if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      _i = (StringPiece *)operator_new__(uVar6);
      stkvec[0x10]._8_8_ = _i;
      if (uVar5 != 0) {
        local_350 = _i;
        do {
          StringPiece::StringPiece(local_350);
          local_350 = local_350 + 1;
        } while (local_350 != _i + uVar5);
      }
    }
    pSVar9 = pSStack_20;
    iVar3 = StringPiece::size(pSStack_20);
    bVar2 = Match(this,pSVar9,0,iVar3,consumed_local._4_4_,(StringPiece *)stkvec[0x10]._8_8_,
                  (int)vec);
    if (bVar2) {
      if (args_local != (Arg **)0x0) {
        pcVar7 = StringPiece::end((StringPiece *)stkvec[0x10]._8_8_);
        pcVar8 = StringPiece::begin(pSStack_20);
        *(int *)args_local = (int)pcVar7 - (int)pcVar8;
      }
      if ((local_3c == 0) || (ppAStack_38 == (Arg **)0x0)) {
        if (_i != (StringPiece *)0x0) {
          operator_delete__(_i);
        }
        this_local._7_1_ = true;
      }
      else {
        iVar3 = NumberOfCapturingGroups(this);
        if (iVar3 < local_3c) {
          if (_i != (StringPiece *)0x0) {
            operator_delete__(_i);
          }
          this_local._7_1_ = false;
        }
        else {
          for (s._0_4_ = 0; (int)s < local_3c; s._0_4_ = (int)s + 1) {
            pSVar9 = (StringPiece *)(stkvec[0x10]._8_8_ + (long)((int)s + 1) * 0x10);
            this_00 = ppAStack_38[(int)s];
            str = StringPiece::data(pSVar9);
            iVar3 = StringPiece::size(pSVar9);
            bVar2 = Arg::Parse(this_00,str,iVar3);
            if (!bVar2) {
              if (_i != (StringPiece *)0x0) {
                operator_delete__(_i);
              }
              return false;
            }
          }
          if (_i != (StringPiece *)0x0) {
            operator_delete__(_i);
          }
          this_local._7_1_ = true;
        }
      }
    }
    else {
      if (_i != (StringPiece *)0x0) {
        operator_delete__(_i);
      }
      this_local._7_1_ = false;
    }
  }
  else {
    bVar2 = Options::log_errors(&this->options_);
    if (bVar2) {
      LogMessage::LogMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x326
                 ,2);
      poVar4 = LogMessage::stream(&local_1c0);
      poVar4 = std::operator<<(poVar4,"Invalid RE2: ");
      std::operator<<(poVar4,(string *)this->error_);
      LogMessage::~LogMessage(&local_1c0);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RE2::DoMatch(const StringPiece& text,
                  Anchor anchor,
                  int* consumed,
                  const Arg* const* args,
                  int n) const {
  if (!ok()) {
    if (options_.log_errors())
      LOG(ERROR) << "Invalid RE2: " << *error_;
    return false;
  }

  // Count number of capture groups needed.
  int nvec;
  if (n == 0 && consumed == NULL)
    nvec = 0;
  else
    nvec = n+1;

  StringPiece* vec;
  StringPiece stkvec[kVecSize];
  StringPiece* heapvec = NULL;

  if (nvec <= arraysize(stkvec)) {
    vec = stkvec;
  } else {
    vec = new StringPiece[nvec];
    heapvec = vec;
  }

  if (!Match(text, 0, text.size(), anchor, vec, nvec)) {
    delete[] heapvec;
    return false;
  }

  if (consumed != NULL)
    *consumed = static_cast<int>(vec[0].end() - text.begin());

  if (n == 0 || args == NULL) {
    // We are not interested in results
    delete[] heapvec;
    return true;
  }

  int ncap = NumberOfCapturingGroups();
  if (ncap < n) {
    // RE has fewer capturing groups than number of arg pointers passed in
    VLOG(1) << "Asked for " << n << " but only have " << ncap;
    delete[] heapvec;
    return false;
  }

  // If we got here, we must have matched the whole pattern.
  for (int i = 0; i < n; i++) {
    const StringPiece& s = vec[i+1];
    if (!args[i]->Parse(s.data(), s.size())) {
      // TODO: Should we indicate what the error was?
      VLOG(1) << "Parse error on #" << i << " " << s << " "
              << (void*)s.data() << "/" << s.size();
      delete[] heapvec;
      return false;
    }
  }

  delete[] heapvec;
  return true;
}